

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O3

void __thiscall KmerCounter::write_counts(KmerCounter *this,ofstream *count_file)

{
  pointer pbVar1;
  pointer pvVar2;
  pointer puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  pointer pbVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *v_1;
  pointer pvVar5;
  uint64_t count;
  uint64_t count_1;
  size_type local_40;
  long local_38;
  
  std::ostream::write((char *)count_file,(long)&this->k);
  std::ostream::write((char *)count_file,(long)&this->count_mode);
  local_40 = (this->name)._M_string_length;
  std::ostream::write((char *)count_file,(long)&local_40);
  std::ostream::write((char *)count_file,(long)(this->name)._M_dataplus._M_p);
  local_38 = (long)(this->count_names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->count_names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
  std::ostream::write((char *)count_file,(long)&local_38);
  pbVar4 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    do {
      local_40 = pbVar4->_M_string_length;
      std::ostream::write((char *)count_file,(long)&local_40);
      std::ostream::write((char *)count_file,(long)(pbVar4->_M_dataplus)._M_p);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  if (this->k < ' ') {
    local_40 = (long)(this->kindex).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->kindex).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    std::ostream::write((char *)count_file,(long)&local_40);
    if (local_40 == 0) goto LAB_00199928;
    puVar3 = (pointer)(this->kindex).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
  }
  else {
    local_40 = (long)(this->kindex128).
                     super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->kindex128).
                     super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4;
    std::ostream::write((char *)count_file,(long)&local_40);
    if (local_40 == 0) goto LAB_00199928;
    puVar3 = (this->kindex128).
             super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::ostream::write((char *)count_file,(long)puVar3);
LAB_00199928:
  local_38 = ((long)(this->counts).
                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->counts).
                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  std::ostream::write((char *)count_file,(long)&local_38);
  if (local_38 != 0) {
    pvVar5 = (this->counts).
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (this->counts).
             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pvVar5 != pvVar2) {
      do {
        local_40 = (long)(pvVar5->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar5->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 1;
        std::ostream::write((char *)count_file,(long)&local_40);
        if (local_40 != 0) {
          std::ostream::write((char *)count_file,
                              (long)(pvVar5->
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
        }
        pvVar5 = pvVar5 + 1;
      } while (pvVar5 != pvVar2);
    }
  }
  return;
}

Assistant:

void KmerCounter::write_counts(std::ofstream &count_file) const {
    count_file.write((char *) &k, sizeof(k));
    count_file.write((char *) &count_mode, sizeof(count_mode));
    sdglib::write_string(count_file,name);
    sdglib::write_stringvector(count_file,count_names);
    if (k<=31) sdglib::write_flat_vector(count_file,kindex);
    else sdglib::write_flat_vector(count_file,kindex128);
    sdglib::write_flat_vectorvector(count_file,counts);
}